

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O2

void __thiscall KDIS::KDataStream::Write<int>(KDataStream *this,int T)

{
  KUINT8 i;
  long lVar1;
  NetToDataType<int> OctArray;
  uchar local_1d;
  NetToDataType<int> local_1c;
  
  local_1c.m_Value = T;
  if (this->m_MachineEndian != this->m_NetEndian) {
    NetToDataType<int>::SwapBytes(&local_1c);
  }
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    local_1d = *(uchar *)((long)&local_1c + lVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->m_vBuffer,&local_1d);
  }
  return;
}

Assistant:

void KDataStream::Write( Type T )
{
    KBOOL bSwapBytes = true;
    if (m_MachineEndian == m_NetEndian)
        bSwapBytes = false;

    NetToDataType<Type> OctArray( T, bSwapBytes );

    for( KUINT8 i = 0; i < sizeof T; ++i )
    {
        m_vBuffer.push_back( OctArray.m_Octs[i] );
    }
}